

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setNamedItemNS(DOMNamedNodeMapImpl *this,DOMNode *arg)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  DOMNodeImpl *pDVar8;
  DOMDocument *pDVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMException *this_00;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  DOMNode *pDVar10;
  ulong index_00;
  XMLSize_t index;
  long lVar11;
  DOMNode *p;
  undefined8 *puVar12;
  DOMDocument *pDVar7;
  
  iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
  pDVar7 = (DOMDocument *)CONCAT44(extraout_var,iVar3);
  pDVar8 = castToNodeImpl(arg);
  pDVar9 = DOMNodeImpl::getOwnerDocument(pDVar8);
  if (pDVar9 == pDVar7) {
    bVar2 = readOnly(this);
    if (bVar2) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      puVar12 = &XMLPlatformUtils::fgMemoryManager;
      if (this->fOwnerNode != (DOMNode *)0x0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_06,iVar3) != 0) {
          iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          puVar12 = (undefined8 *)(CONCAT44(extraout_var_07,iVar3) + 0x158);
        }
      }
      DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar12);
    }
    else {
      if ((*(uint *)&pDVar8->flags & 8) == 0) {
        pDVar8->fOwnerNode = this->fOwnerNode;
        pDVar8->flags = (ushort)*(uint *)&pDVar8->flags | 8;
        iVar3 = (*arg->_vptr_DOMNode[0x16])(arg);
        iVar4 = (*arg->_vptr_DOMNode[0x18])(arg);
        lVar11 = 0;
        do {
          if (lVar11 == 0xc1) {
            iVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[2])(this,arg);
            return (DOMNode *)CONCAT44(extraout_var_05,iVar3);
          }
          if (this->fBuckets[lVar11] != (DOMNodeVector *)0x0) {
            uVar1 = this->fBuckets[lVar11]->nextFreeSlot;
            for (index_00 = 0; uVar1 != index_00; index_00 = index_00 + 1) {
              if (index_00 < this->fBuckets[lVar11]->nextFreeSlot) {
                p = this->fBuckets[lVar11]->data[index_00];
              }
              else {
                p = (DOMNode *)0x0;
              }
              iVar5 = (*p->_vptr_DOMNode[0x16])(p);
              iVar6 = (*p->_vptr_DOMNode[0x18])(p);
              bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar5),
                                        (XMLCh *)CONCAT44(extraout_var_00,iVar3));
              if (bVar2) {
                bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar4),
                                          (XMLCh *)CONCAT44(extraout_var_03,iVar6));
                if (bVar2) {
LAB_002807e2:
                  DOMNodeVector::setElementAt(this->fBuckets[lVar11],arg,index_00);
                  pDVar10 = &pDVar7->super_DOMNode;
                  if (pDVar7 == (DOMDocument *)0x0) {
                    pDVar10 = (DOMNode *)0x0;
                  }
                  pDVar8 = castToNodeImpl(p);
                  pDVar8->fOwnerNode = pDVar10;
                  pDVar8 = castToNodeImpl(p);
                  pDVar8->flags = pDVar8->flags & 0xfff7;
                  return p;
                }
                if ((XMLCh *)CONCAT44(extraout_var_03,iVar6) == (XMLCh *)0x0) {
                  iVar5 = (*p->_vptr_DOMNode[2])(p);
                  bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar4),
                                            (XMLCh *)CONCAT44(extraout_var_04,iVar5));
                  if (bVar2) goto LAB_002807e2;
                }
              }
            }
          }
          lVar11 = lVar11 + 1;
        } while( true );
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      puVar12 = &XMLPlatformUtils::fgMemoryManager;
      if (this->fOwnerNode != (DOMNode *)0x0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_10,iVar3) != 0) {
          iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          puVar12 = (undefined8 *)(CONCAT44(extraout_var_11,iVar3) + 0x158);
        }
      }
      DOMException::DOMException(this_00,10,0,(MemoryManager *)*puVar12);
    }
  }
  else {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    puVar12 = &XMLPlatformUtils::fgMemoryManager;
    if (this->fOwnerNode != (DOMNode *)0x0) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_08,iVar3) != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar12 = (undefined8 *)(CONCAT44(extraout_var_09,iVar3) + 0x158);
      }
    }
    DOMException::DOMException(this_00,4,0,(MemoryManager *)*puVar12);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode * DOMNamedNodeMapImpl::setNamedItemNS(DOMNode *arg)
{
    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if (argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR,0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (argImpl->isOwned())
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);

    const XMLCh* namespaceURI=arg->getNamespaceURI();
    const XMLCh* localName=arg->getLocalName();
    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->setElementAt(arg,i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    // if not found, add it using the full name as key
    return setNamedItem(arg);
}